

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void rcv_thread(int sockfd)

{
  packet *__buf;
  int iVar1;
  int extraout_EAX;
  ssize_t sVar2;
  int iVar3;
  int iVar4;
  
  pckt = (packet *)calloc(1,0x406);
  sVar2 = recv(sockfd,pckt,0x406,0);
  iVar3 = (int)sVar2;
  while (1 < iVar3 + 1U) {
    if (typewin == (WINDOW *)0x0) {
      iVar3 = -1;
      iVar4 = -1;
    }
    else {
      iVar3 = (int)typewin->_cury;
      iVar4 = (int)typewin->_curx;
    }
    wattr_on(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    wprintw(chatwin,"%s: ",pckt);
    wattr_off(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    wprintw(chatwin,"%s\n",pckt->msg);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutwin);
    if (iVar1 != 0) goto LAB_0010298a;
    wrefresh(chatwin);
    wrefresh(typewin);
    wmove(typewin,iVar3,iVar4);
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
    __buf = pckt;
    memset(pckt,0,0x406);
    sVar2 = recv(sockfd,__buf,0x406,0);
    iVar3 = (int)sVar2;
  }
  perror("Erro ao receber mensagem\n");
  exit_();
  iVar1 = extraout_EAX;
LAB_0010298a:
  std::__throw_system_error(iVar1);
}

Assistant:

void rcv_thread(int sockfd) {
  pckt = (struct packet*)malloc(PACKET_LEN);

  while(1) {
    memset(pckt, 0, PACKET_LEN);

    int mlen = recv(sockfd, pckt, PACKET_LEN, 0);
    if(mlen == -1 || mlen == 0) {
      perror("Erro ao receber mensagem\n");
      exit_();
    }
    int y,x;

    getyx(typewin, y, x);


    wattron(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s: ", pckt->name);
    wattroff(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s\n", pckt->msg);

    mutwin.lock();
    wrefresh(chatwin);
    wrefresh(typewin);
    wmove(typewin, y,x);
    mutwin.unlock();
  }
}